

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

void __thiscall S2CellUnion::Expand(S2CellUnion *this,S1Angle min_radius,int max_level_diff)

{
  bool bVar1;
  reference pSVar2;
  int *piVar3;
  double dVar4;
  double dVar5;
  int local_4c;
  int local_48;
  int local_44;
  int radius_level;
  S2CellId id;
  const_iterator __end1;
  const_iterator __begin1;
  S2CellUnion *__range1;
  int min_level;
  int max_level_diff_local;
  S2CellUnion *this_local;
  S1Angle min_radius_local;
  
  __range1._0_4_ = 0x1e;
  __range1._4_4_ = max_level_diff;
  _min_level = this;
  this_local = (S2CellUnion *)min_radius.radians_;
  __end1 = begin(this);
  id.id_ = (uint64)end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
                                *)&id);
    if (!bVar1) break;
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>
             ::operator*(&__end1);
    _radius_level = pSVar2->id_;
    local_44 = S2CellId::level((S2CellId *)&radius_level);
    piVar3 = std::min<int>((int *)&__range1,&local_44);
    __range1._0_4_ = *piVar3;
    __gnu_cxx::
    __normal_iterator<const_S2CellId_*,_std::vector<S2CellId,_std::allocator<S2CellId>_>_>::
    operator++(&__end1);
  }
  dVar4 = S1Angle::radians((S1Angle *)&this_local);
  local_48 = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,dVar4);
  if (local_48 == 0) {
    dVar4 = S1Angle::radians((S1Angle *)&this_local);
    dVar5 = S2::Metric<1>::GetValue((Metric<1> *)&S2::kMinWidth,0);
    if (dVar5 < dVar4) {
      Expand(this,0);
    }
  }
  local_4c = (int)__range1 + __range1._4_4_;
  piVar3 = std::min<int>(&local_4c,&local_48);
  Expand(this,*piVar3);
  return;
}

Assistant:

void S2CellUnion::Expand(S1Angle min_radius, int max_level_diff) {
  int min_level = S2CellId::kMaxLevel;
  for (S2CellId id : *this) {
    min_level = min(min_level, id.level());
  }
  // Find the maximum level such that all cells are at least "min_radius" wide.
  int radius_level = S2::kMinWidth.GetLevelForMinValue(min_radius.radians());
  if (radius_level == 0 && min_radius.radians() > S2::kMinWidth.GetValue(0)) {
    // The requested expansion is greater than the width of a face cell.
    // The easiest way to handle this is to expand twice.
    Expand(0);
  }
  Expand(min(min_level + max_level_diff, radius_level));
}